

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O2

void rw::writeTGA(Image *image,char *filename)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint8 *puVar4;
  FILE *__stream;
  int iVar5;
  undefined4 extraout_var;
  byte *pbVar6;
  char *pcVar7;
  size_t __n;
  ushort uVar8;
  int y;
  StreamFile *pSVar9;
  int x;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  undefined1 auVar13 [16];
  StreamFile local_60;
  byte *local_50;
  Error _e;
  
  local_60.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00142c08;
  local_60.file = (void *)0x0;
  iVar5 = StreamFile::open(&local_60,filename,0x12d08b);
  if (CONCAT44(extraout_var,iVar5) == 0) {
    _e.plugin = 0;
    _e.code = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tga.cpp",0xa1);
    __stream = _stderr;
    pcVar7 = dbgsprint(0x80000003,filename);
    fprintf(__stream,"%s\n",pcVar7);
    setError(&_e);
  }
  else {
    puVar4 = image->palette;
    uVar3 = image->depth;
    uVar8 = 0x10;
    if (uVar3 != 4) {
      uVar8 = (ushort)(uVar3 == 8) << 8;
    }
    _e = (Error)(CONCAT26(uVar8,(int6)CONCAT52(_e._3_5_,CONCAT11((puVar4 == (uint8 *)0x0) + '\x01',
                                                                 puVar4 != (uint8 *)0x0)) << 8) &
                0xffff0000ffffffff);
    uVar1 = image->width;
    uVar2 = image->height;
    auVar13._4_4_ = uVar2;
    auVar13._0_4_ = uVar1;
    auVar13._8_8_ = 0;
    pshuflw(auVar13,auVar13,0xe8);
    __n = 8;
    if (uVar3 != 4) {
      __n = (size_t)uVar3;
    }
    pSVar9 = &local_60;
    TGAHeader::write((TGAHeader *)&_e,(int)pSVar9,(void *)((ulong)(uVar3 == 8) << 8),__n);
    if ((puVar4 != (uint8 *)0x0) && (puVar4 = image->palette, puVar4 != (uint8 *)0x0)) {
      for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4 + 2]);
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4 + 1]);
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4]);
        pSVar9 = (StreamFile *)(ulong)puVar4[uVar11 * 4 + 3];
        Stream::writeU8(&local_60.super_Stream,puVar4[uVar11 * 4 + 3]);
      }
    }
    pbVar12 = image->pixels;
    for (iVar5 = 0; iVar5 < image->height; iVar5 = iVar5 + 1) {
      local_50 = pbVar12;
      for (iVar10 = 0; iVar10 < image->width; iVar10 = iVar10 + 1) {
        pbVar6 = pbVar12;
        switch(image->depth << 0x1e | image->depth - 4U >> 2) {
        case 0:
        case 1:
          break;
        default:
          goto switchD_0010ed06_caseD_2;
        case 3:
          Stream::writeU8(&local_60.super_Stream,*pbVar12);
          pbVar6 = pbVar12 + 1;
          break;
        case 5:
          Stream::writeU8(&local_60.super_Stream,pbVar12[2]);
          Stream::writeU8(&local_60.super_Stream,pbVar12[1]);
          break;
        case 7:
          Stream::writeU8(&local_60.super_Stream,pbVar12[2]);
          Stream::writeU8(&local_60.super_Stream,pbVar12[1]);
          Stream::writeU8(&local_60.super_Stream,*pbVar12);
          pbVar6 = pbVar12 + 3;
        }
        pSVar9 = (StreamFile *)(ulong)*pbVar6;
        Stream::writeU8(&local_60.super_Stream,*pbVar6);
switchD_0010ed06_caseD_2:
        pbVar12 = pbVar12 + image->bpp;
      }
      pbVar12 = local_50 + image->stride;
    }
    StreamFile::close(&local_60,(int)pSVar9);
  }
  return;
}

Assistant:

void
writeTGA(Image *image, const char *filename)
{
	TGAHeader header;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}
	header.IDlen = 0;
	header.imageType = image->palette != nil ? 1 : 2;
	header.colorMapType = image->palette != nil;
	header.colorMapOrigin = 0;
	header.colorMapLength = image->depth == 4 ? 16 :
	                        image->depth == 8 ? 256 : 0;
	header.colorMapDepth = image->palette ? 32 : 0;
	header.xOrigin = 0;
	header.yOrigin = 0;
	header.width = image->width;
	header.height = image->height;
	header.depth = image->depth == 4 ? 8 : image->depth;
	header.descriptor = 0x20 | (image->depth == 32 ? 8 : 0);
	header.write(&file);

	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = (uint8(*)[4])palette;;
	if(palette)
		for(int i = 0; i < header.colorMapLength; i++){
			file.writeU8(color[i][2]);
			file.writeU8(color[i][1]);
			file.writeU8(color[i][0]);
			file.writeU8(color[i][3]);
		}

	uint8 *line = image->pixels;
	uint8 *p;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				file.writeU8(p[0]);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				file.writeU8(p[3]);
				break;
			}
			p += image->bpp;
		}
		line += image->stride;
	}
	file.close();
}